

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O1

void __thiscall TPZMHMeshControl::DivideWrap(TPZMHMeshControl *this,TPZGeoEl *wrapelement)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  TPZGeoEl *pTVar6;
  TPZAutoPointer<TPZRefPattern> *this_00;
  int iVar7;
  TPZGeoElSide neighbour;
  TPZAutoPointer<TPZRefPattern> siderefpattern_1;
  TPZGeoElSide gelside;
  TPZStack<TPZGeoEl_*,_10> subels;
  TPZStack<TPZGeoElSide,_10> subelsides;
  TPZGeoElSide local_228;
  undefined1 local_210 [56];
  TPZGeoEl *local_1d8;
  int local_1d0;
  undefined1 local_1c8 [32];
  TPZGeoEl *local_1a8 [8];
  undefined8 auStack_168 [2];
  undefined1 local_158 [32];
  TPZGeoElSide local_138 [10];
  TPZGeoElSide local_48;
  
  local_210._24_8_ = this;
  local_1d0 = (**(code **)(*(long *)wrapelement + 0xf0))(wrapelement);
  local_1d0 = local_1d0 + -1;
  local_210._48_8_ = &PTR__TPZGeoElSide_01920090;
  local_1d8 = wrapelement;
  iVar1 = TPZGeoElSide::Dimension((TPZGeoElSide *)(local_210 + 0x30));
  local_210._16_8_ = wrapelement;
  if (local_1d8 == (TPZGeoEl *)0x0) {
    local_228.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
    local_228.fGeoEl = (TPZGeoEl *)0x0;
    local_228.fSide = -1;
  }
  else {
    (**(code **)(*(long *)local_1d8 + 0x188))(&local_228,local_1d8,local_1d0);
  }
  if ((local_228.fGeoEl != local_1d8) || (local_228.fSide != local_1d0)) {
    do {
      iVar2 = (**(code **)(*(long *)local_228.fGeoEl + 0x1d0))();
      if ((iVar2 != 0) && (iVar2 = TPZGeoElSide::NSubElements(&local_228), 1 < iVar2)) {
        local_210._8_8_ = &PTR__TPZManVector_01842518;
        lVar4 = 0x30;
        do {
          *(undefined ***)((long)auStack_168 + lVar4) = &PTR__TPZGeoElSide_01920090;
          *(undefined8 *)((long)auStack_168 + lVar4 + 8) = 0;
          *(undefined4 *)(local_158 + lVar4) = 0xffffffff;
          lVar4 = lVar4 + 0x18;
        } while (lVar4 != 0x120);
        local_158._8_8_ = local_138;
        local_158._16_8_ = 0;
        local_158._24_8_ = 0;
        local_158._0_8_ = &PTR__TPZManVector_018421d8;
        TPZGeoElSide::GetSubElements2(&local_228,(TPZStack<TPZGeoElSide,_10> *)local_158);
        if ((int)(uint)local_158._16_8_ < 1) {
          iVar2 = 0;
          iVar7 = 0;
        }
        else {
          uVar5 = (ulong)((uint)local_158._16_8_ & 0x7fffffff);
          lVar4 = 0;
          iVar7 = 0;
          iVar2 = 0;
          do {
            iVar3 = TPZGeoElSide::Dimension
                              ((TPZGeoElSide *)
                               ((long)&((TPZSavable *)local_158._8_8_)->_vptr_TPZSavable + lVar4));
            if (iVar3 == iVar1) {
              local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090
              ;
              local_48.fSide = *(int *)((long)(local_158._8_8_ + 0x10) + lVar4);
              local_48.fGeoEl = *(TPZGeoEl **)((long)(local_158._8_8_ + 8) + lVar4);
              iVar3 = HasWrapNeighbour((TPZMHMeshControl *)local_210._24_8_,&local_48);
              iVar7 = iVar7 + 1;
              iVar2 = (iVar2 + 1) - (uint)(iVar3 == 0);
            }
            lVar4 = lVar4 + 0x18;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        iVar1 = local_228.fSide;
        if (iVar2 != iVar7 && iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"I don\'t understand\n",0x13);
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                     ,0x9fd);
        }
        if (iVar2 != 0) goto LAB_013c170b;
        iVar2 = TPZGeoElSide::NSides(&local_228);
        if (iVar1 == iVar2 + -1) {
          (**(code **)(*(long *)local_228.fGeoEl + 0x2b0))(local_1c8);
          pTVar6 = (TPZGeoEl *)local_210._16_8_;
          if (((_func_int **)local_1c8._0_8_ == (_func_int **)0x0) ||
             (*(_func_int **)local_1c8._0_8_ == (_func_int *)0x0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"void TPZMHMeshControl::DivideWrap(TPZGeoEl *)",0x2d);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout," We expect elements to have refinement patterns\n",
                       0x30);
          }
          else {
            local_210._40_8_ = local_1c8._0_8_;
            LOCK();
            *(int *)(local_1c8._0_8_ + 8) = *(int *)(local_1c8._0_8_ + 8) + 1;
            UNLOCK();
            (**(code **)(*(long *)local_210._16_8_ + 0x2a8))(local_210._16_8_);
            this_00 = (TPZAutoPointer<TPZRefPattern> *)(local_210 + 0x28);
LAB_013c1608:
            TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(this_00);
          }
        }
        else {
          (**(code **)(*(long *)local_228.fGeoEl + 0x2b0))(local_1c8);
          pTVar6 = (TPZGeoEl *)local_210._16_8_;
          if (((_func_int **)local_1c8._0_8_ != (_func_int **)0x0) &&
             (*(_func_int **)local_1c8._0_8_ != (_func_int *)0x0)) {
            TPZRefPattern::SideRefPattern
                      ((TPZRefPattern *)local_210,(int)*(_func_int **)local_1c8._0_8_);
            if (((_func_int **)local_210._0_8_ == (_func_int **)0x0) ||
               (*(_func_int **)local_210._0_8_ == (_func_int *)0x0)) {
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                         ,0xa17);
            }
            local_210._32_8_ = local_210._0_8_;
            LOCK();
            *(int *)(local_210._0_8_ + 8) = *(int *)(local_210._0_8_ + 8) + 1;
            UNLOCK();
            (**(code **)(*(long *)pTVar6 + 0x2a8))(pTVar6);
            TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                      ((TPZAutoPointer<TPZRefPattern> *)(local_210 + 0x20));
            this_00 = (TPZAutoPointer<TPZRefPattern> *)local_210;
            goto LAB_013c1608;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"void TPZMHMeshControl::DivideWrap(TPZGeoEl *)",0x2d);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," We expect elements to have refinement patterns\n",0x30)
          ;
        }
        TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_1c8);
        TPZStack<TPZGeoEl_*,_10>::TPZStack((TPZStack<TPZGeoEl_*,_10> *)local_1c8);
        (**(code **)(*(long *)pTVar6 + 0x1c0))(pTVar6,local_1c8);
        if (0 < (long)local_1c8._16_8_) {
          lVar4 = 0;
          do {
            DivideWrap((TPZMHMeshControl *)local_210._24_8_,
                       *(TPZGeoEl **)(local_1c8._8_8_ + lVar4 * 8));
            lVar4 = lVar4 + 1;
          } while (lVar4 < (long)local_1c8._16_8_);
        }
        if ((TPZGeoEl **)local_1c8._8_8_ == local_1a8) {
          local_1c8._8_8_ = (TPZGeoEl **)0x0;
        }
        local_1c8._24_8_ = 0;
        local_1c8._0_8_ = &PTR__TPZVec_0183b770;
        if ((TPZGeoEl **)local_1c8._8_8_ != (TPZGeoEl **)0x0) {
          operator_delete__((void *)local_1c8._8_8_);
        }
LAB_013c170b:
        if ((TPZGeoElSide *)local_158._8_8_ == local_138) {
          local_158._8_8_ = (TPZGeoElSide *)0x0;
        }
        local_158._24_8_ = 0;
        local_158._0_8_ = &PTR__TPZVec_0183b870;
        if ((TPZGeoElSide *)local_158._8_8_ == (TPZGeoElSide *)0x0) {
          return;
        }
        operator_delete__(&((TPZGeoElSide *)(local_158._8_8_ + -0x18))->fSide,
                          *(long *)&((TPZGeoElSide *)(local_158._8_8_ + -0x18))->fSide * 0x18 + 8);
        return;
      }
      if (local_228.fGeoEl == (TPZGeoEl *)0x0) {
        local_158._0_8_ = &PTR__TPZGeoElSide_01920090;
        local_158._8_8_ = (TPZGeoEl *)0x0;
        local_158._16_4_ = 0xffffffff;
      }
      else {
        (**(code **)(*(long *)local_228.fGeoEl + 0x188))(local_158,local_228.fGeoEl,local_228.fSide)
        ;
      }
      local_228.fSide = local_158._16_4_;
      local_228.fGeoEl = (TPZGeoEl *)local_158._8_8_;
    } while (((TPZGeoEl *)local_158._8_8_ != local_1d8) || (local_158._16_4_ != local_1d0));
  }
  return;
}

Assistant:

void TPZMHMeshControl::DivideWrap(TPZGeoEl *wrapelement)
{
    TPZGeoElSide gelside(wrapelement, wrapelement->NSides()-1);
    int dim = gelside.Dimension();
    TPZGeoElSide neighbour = gelside.Neighbour();
    while (neighbour != gelside) {
        if(neighbour.Element()->HasSubElement() && neighbour.NSubElements() > 1)
        {
            // verify if the subelements are connected to a wrap element
            TPZStack<TPZGeoElSide> subelsides;
            neighbour.GetSubElements2(subelsides);
            int nsub = subelsides.size();
            int nwrap = 0;
            int nsidesdim = 0;
            for(int isub = 0; isub<nsub; isub++)
            {
                if(subelsides[isub].Dimension() == dim)
                {
                    nsidesdim++;
                }
                else continue;
                if(HasWrapNeighbour(subelsides[isub])) nwrap++;
            }
            if(nwrap != 0 && nwrap != nsidesdim)
            {
                std::cout << "I don't understand\n";
                DebugStop();
            }
            if(nwrap != 0) return;
            if (neighbour.Side() == neighbour.NSides()-1) {
                TPZAutoPointer<TPZRefPattern> siderefpattern = neighbour.Element()->GetRefPattern();
                if(!siderefpattern)
                {
                    std::cout << __PRETTY_FUNCTION__ << " We expect elements to have refinement patterns\n";
//                    DebugStop();
                }
                else
                {
                    wrapelement->SetRefPattern(siderefpattern);
                }
            }
            else
            {
                TPZAutoPointer<TPZRefPattern> elrefpattern = neighbour.Element()->GetRefPattern();
                if(!elrefpattern)
                {
                    std::cout << __PRETTY_FUNCTION__ << " We expect elements to have refinement patterns\n";
//                    DebugStop();
                }
                else
                {
                    TPZAutoPointer<TPZRefPattern> siderefpattern = elrefpattern->SideRefPattern(neighbour.Side());
                    if(!siderefpattern) DebugStop();
                    wrapelement->SetRefPattern(siderefpattern);
                }
            }
            TPZStack<TPZGeoEl *> subels;

            wrapelement->Divide(subels);
#ifdef PZDEBUG
            if(subels.size() == 1)
            {
                DebugStop();
            }
#endif
#ifdef PZ_LOG
            if(loggerWRAP.isDebugEnabled())
            {
                std::stringstream sout;
                sout << std::endl;
                for (int is=0; is<subels.size(); is++) {
                    sout << "Created a son wrap element of " << wrapelement->Index() <<
                    " matid " << wrapelement->MaterialId() << " with index " <<
                    subels[is]->Index() << std::endl;
                }
                LOGPZ_DEBUG(loggerWRAP, sout.str())
            }
#endif
            for (int is=0; is<subels.size(); is++) {
                DivideWrap(subels[is]);
            }
            break;
        }
        neighbour = neighbour.Neighbour();
    }
}